

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O3

type jsoncons::decode_base16<char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (char *first,char *last,vector<unsigned_char,_std::allocator<unsigned_char>_> *result
               )

{
  pointer *ppuVar1;
  iterator __position;
  byte bVar2;
  undefined8 in_RAX;
  byte bVar3;
  undefined8 uVar4;
  byte *pbVar5;
  type tVar6;
  undefined8 uStack_38;
  
  uVar4 = 0x18;
  if (((int)last - (int)first & 1U) == 0) {
    if (first != last) {
      pbVar5 = (byte *)first;
      uStack_38 = in_RAX;
      do {
        bVar2 = *pbVar5;
        if ((byte)(bVar2 - 0x30) < 10) {
          bVar2 = bVar2 << 4;
        }
        else {
          if (5 < (byte)((bVar2 | 0x20) + 0x9f)) goto LAB_00248ee9;
          bVar2 = bVar2 * '\x10' + 0x90;
        }
        bVar3 = pbVar5[1] - 0x30;
        if (9 < bVar3) {
          bVar3 = pbVar5[1] | 0x20;
          if (5 < (byte)(bVar3 + 0x9f)) goto LAB_00248ee9;
          bVar3 = bVar3 + 0xa9;
        }
        uStack_38 = CONCAT17(bVar3 | bVar2,(undefined7)uStack_38);
        __position._M_current =
             (result->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (result->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)result,__position,
                     (uchar *)((long)&uStack_38 + 7));
        }
        else {
          *__position._M_current = bVar3 | bVar2;
          ppuVar1 = &(result->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        pbVar5 = pbVar5 + 2;
      } while (pbVar5 != (byte *)last);
    }
    uVar4 = 0;
    first = last;
  }
LAB_00248ee9:
  tVar6._8_8_ = uVar4;
  tVar6.it = first;
  return tVar6;
}

Assistant:

typename std::enable_if<ext_traits::is_back_insertable_byte_container<Container>::value,decode_result<InputIt>>::type 
    decode_base16(InputIt first, InputIt last, Container& result)
    {
        std::size_t len = std::distance(first,last);
        if (len & 1) 
        {
            return decode_result<InputIt>{first, conv_errc::not_base16};
        }

        InputIt it = first;
        while (it != last)
        {
            uint8_t val;
            auto a = *it++;
            if (a >= '0' && a <= '9') 
            {
                val = static_cast<uint8_t>(a - '0') << 4;
            } 
            else if ((a | 0x20) >= 'a' && (a | 0x20) <= 'f') 
            {
                val = (static_cast<uint8_t>((a | 0x20) - 'a') + 10) << 4;
            } 
            else 
            {
                return decode_result<InputIt>{first, conv_errc::not_base16};
            }

            auto b = *it++;
            if (b >= '0' && b <= '9') 
            {
                val |= (b - '0');
            } 
            else if ((b | 0x20) >= 'a' && (b | 0x20) <= 'f') 
            {
                val |= ((b | 0x20) - 'a' + 10);
            } 
            else 
            {
                return decode_result<InputIt>{first, conv_errc::not_base16};
            }

            result.push_back(val);
        }
        return decode_result<InputIt>{last, conv_errc::success};
    }